

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O1

void __thiscall
r_exec::CSTOverlay::update(CSTOverlay *this,HLPBindingMap *map,_Fact *input,_Fact *bound_pattern)

{
  atomic_int_fast64_t *paVar1;
  HLPBindingMap *pHVar2;
  pointer pPVar3;
  bool bVar4;
  Pred *this_00;
  _Fact *this_01;
  pointer pPVar5;
  __hashtable *__h;
  float fVar6;
  P<r_exec::Sim> simulation;
  __node_gen_type __node_gen;
  _Object *local_40;
  P<r_exec::_Fact> local_38;
  
  pHVar2 = (HLPBindingMap *)(this->super_HLPOverlay).bindings.object;
  if (pHVar2 != map) {
    if (pHVar2 != (HLPBindingMap *)0x0) {
      LOCK();
      paVar1 = &(pHVar2->super_BindingMap).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pHVar2->super_BindingMap).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
        (*(pHVar2->super_BindingMap).super__Object._vptr__Object[1])();
      }
    }
    (this->super_HLPOverlay).bindings.object = (_Object *)map;
    if (map != (HLPBindingMap *)0x0) {
      LOCK();
      paVar1 = &(map->super_BindingMap).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  if (input != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(input->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_38.object = (_Object *)input;
  std::vector<core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>>::
  emplace_back<core::P<r_exec::_Fact>>
            ((vector<core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>> *)&this->inputs,
             &local_38);
  if (local_38.object != (_Object *)0x0) {
    LOCK();
    ((local_38.object)->refCount).super___atomic_base<long>._M_i =
         ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((LObject *)&(local_38.object)->_vptr__Object)->
        super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.super__Object.
        _vptr__Object[1])();
    }
  }
  this_00 = _Fact::get_pred(input);
  if (this_00 == (Pred *)0x0) {
    fVar6 = _Fact::get_cfd(input);
  }
  else {
    this_01 = Pred::get_target(this_00);
    fVar6 = _Fact::get_cfd(this_01);
    bVar4 = Pred::is_simulation(this_00);
    if (bVar4) {
      pPVar5 = (this_00->simulations).
               super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (this_00->simulations).
               super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar5 != pPVar3) {
        do {
          local_40 = pPVar5->object;
          if (local_40 != (_Object *)0x0) {
            LOCK();
            (local_40->refCount).super___atomic_base<long>._M_i =
                 (local_40->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
          local_38.object = (_Object *)&this->simulations;
          std::
          _Hashtable<core::P<r_exec::Sim>,core::P<r_exec::Sim>,std::allocator<core::P<r_exec::Sim>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::Sim>>,r_code::PHash<r_exec::Sim>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<core::P<r_exec::Sim>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<core::P<r_exec::Sim>,true>>>>
                    ((_Hashtable<core::P<r_exec::Sim>,core::P<r_exec::Sim>,std::allocator<core::P<r_exec::Sim>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::Sim>>,r_code::PHash<r_exec::Sim>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&this->simulations,&local_40,&local_38);
          if (local_40 != (_Object *)0x0) {
            LOCK();
            (local_40->refCount).super___atomic_base<long>._M_i =
                 (local_40->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((local_40->refCount).super___atomic_base<long>._M_i < 1) {
              (*local_40->_vptr__Object[1])();
            }
          }
          pPVar5 = pPVar5 + 1;
        } while (pPVar5 != pPVar3);
      }
    }
    else {
      LOCK();
      paVar1 = &(input->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_38.object = (_Object *)&this->predictions;
      local_40 = (_Object *)input;
      std::
      _Hashtable<core::P<r_exec::_Fact>,core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>,std::__detail::_Identity,std::equal_to<core::P<r_exec::_Fact>>,r_code::PHash<r_exec::_Fact>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<core::P<r_exec::_Fact>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<core::P<r_exec::_Fact>,true>>>>
                ();
      if (local_40 != (_Object *)0x0) {
        LOCK();
        (local_40->refCount).super___atomic_base<long>._M_i =
             (local_40->refCount).super___atomic_base<long>._M_i + -1;
        UNLOCK();
        if ((local_40->refCount).super___atomic_base<long>._M_i < 1) {
          (*(((LObject *)&local_40->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>).
            super_LObject.super_Code.super__Object._vptr__Object[1])();
        }
      }
    }
  }
  if ((double)fVar6 < this->lowest_cfd) {
    this->lowest_cfd = (double)fVar6;
  }
  return;
}

Assistant:

void CSTOverlay::update(HLPBindingMap *map, _Fact *input, _Fact *bound_pattern)
{
    bindings = map;
    inputs.push_back(input);
    double last_cfd;
    Pred *prediction = input->get_pred();

    if (prediction) {
        last_cfd = prediction->get_target()->get_cfd();

        if (prediction->is_simulation()) {
            for (P<Sim> simulation : prediction->simulations) {
                simulations.insert(simulation);
            }
        } else {
            predictions.insert(input);
        }
    } else {
        last_cfd = input->get_cfd();
    }

    if (lowest_cfd > last_cfd) {
        lowest_cfd = last_cfd;
    }
}